

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall BackwardPass::ClearDstUseForPostOpLazyBailOut(BackwardPass *this,Instr *instr)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  undefined4 *puVar4;
  StackSym *pSVar5;
  BailOutInfo *this_01;
  
  bVar2 = IR::Instr::HasLazyBailOut(instr);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0xb56,"(instr->HasLazyBailOut())","instr->HasLazyBailOut()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00 = instr->m_dst;
  if ((this_00 != (Opnd *)0x0) && (this->currentPrePassLoop == (Loop *)0x0)) {
    OVar3 = IR::Opnd::GetKind(this_00);
    if (OVar3 == OpndKindReg) {
      pSVar5 = IR::Opnd::GetStackSym(this_00);
      if (pSVar5 != (StackSym *)0x0) {
        this_01 = IR::Instr::GetBailOutInfo(instr);
        BailOutInfo::ClearUseOfDst(this_01,(pSVar5->super_Sym).m_id);
        return;
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::ClearDstUseForPostOpLazyBailOut(IR::Instr *instr)
{
    // Refer to comments on BailOutInfo::ClearUseOfDst()
    Assert(instr->HasLazyBailOut());
    IR::Opnd *dst = instr->GetDst();
    if (!this->IsPrePass() && dst && dst->IsRegOpnd())
    {
        StackSym *stackSym = dst->GetStackSym();
        if (stackSym) {
            instr->GetBailOutInfo()->ClearUseOfDst(stackSym->m_id);
        }
    }
}